

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O1

nhdp_interface * nhdp_interface_add(char *name)

{
  long lVar1;
  nhdp_interface *listener;
  oonf_rfc5444_interface *poVar2;
  undefined8 uVar3;
  ulong uVar4;
  char *pcVar5;
  
  lVar1 = avl_find(&_interface_tree,name);
  listener = (nhdp_interface *)(lVar1 + -0x158);
  if (lVar1 == 0) {
    listener = (nhdp_interface *)oonf_class_malloc(&_interface_info);
    if (listener == (nhdp_interface *)0x0) {
      uVar4 = (ulong)LOG_NHDP;
      if (((&log_global_mask)[uVar4] & 4) != 0) {
        pcVar5 = "No memory left for NHDP interface";
        uVar3 = 0xd6;
LAB_00129b8f:
        oonf_log(4,uVar4,"src/nhdp/nhdp/nhdp_interfaces.c",uVar3,0,0,pcVar5);
        return (nhdp_interface *)0x0;
      }
    }
    else {
      (listener->rfc5444_if).cb_interface_changed = _cb_interface_event;
      poVar2 = oonf_rfc5444_add_interface
                         (_protocol,(oonf_rfc5444_interface_listener *)listener,name);
      if (poVar2 != (oonf_rfc5444_interface *)0x0) {
        (listener->os_if_listener).name = ((listener->rfc5444_if).interface)->name;
        os_interface_linux_add(&listener->os_if_listener);
        (listener->_hello_timer).class = &_interface_hello_timer;
        (listener->_node).key = (listener->rfc5444_if).interface;
        avl_insert(&_interface_tree,&listener->_node);
        avl_init(&listener->_if_addresses,avl_comp_netaddr,0);
        (listener->_links).prev = &listener->_links;
        (listener->_links).next = &listener->_links;
        avl_init(&listener->_link_addresses,avl_comp_netaddr,0);
        avl_init(&listener->_link_originators,avl_comp_netaddr,1);
        avl_init(&listener->_if_twohops,avl_comp_netaddr,1);
        oonf_class_event(&_interface_info,listener,OONF_OBJECT_ADDED);
        goto LAB_001299a6;
      }
      oonf_class_free(&_interface_info,listener);
      uVar4 = (ulong)LOG_NHDP;
      if (((&log_global_mask)[uVar4] & 4) != 0) {
        pcVar5 = "Cannot allocate rfc5444 interface for %s";
        uVar3 = 0xdd;
        goto LAB_00129b8f;
      }
    }
    listener = (nhdp_interface *)0x0;
  }
  else {
LAB_001299a6:
    if (((&log_global_mask)[LOG_NHDP] & 2) != 0) {
      oonf_log(2,(ulong)LOG_NHDP,"src/nhdp/nhdp/nhdp_interfaces.c",0x106,0,0,
               "Add interface to NHDP_interface tree: %s (refcount was %d)",name,listener->_refcount
              );
    }
    listener->_refcount = listener->_refcount + 1;
  }
  return listener;
}

Assistant:

struct nhdp_interface *
nhdp_interface_add(const char *name) {
  struct nhdp_interface *interf;

  interf = avl_find_element(&_interface_tree, name, interf, _node);
  if (interf == NULL) {
    interf = oonf_class_malloc(&_interface_info);
    if (interf == NULL) {
      OONF_WARN(LOG_NHDP, "No memory left for NHDP interface");
      return NULL;
    }

    interf->rfc5444_if.cb_interface_changed = _cb_interface_event;
    if (!oonf_rfc5444_add_interface(_protocol, &interf->rfc5444_if, name)) {
      oonf_class_free(&_interface_info, interf);
      OONF_WARN(LOG_NHDP, "Cannot allocate rfc5444 interface for %s", name);
      return NULL;
    }

    /* allocate core interface */
    interf->os_if_listener.name = interf->rfc5444_if.interface->name;
    os_interface_add(&interf->os_if_listener);

    /* initialize timers */
    interf->_hello_timer.class = &_interface_hello_timer;

    /* hook into global interface tree */
    interf->_node.key = interf->rfc5444_if.interface->name;
    avl_insert(&_interface_tree, &interf->_node);

    /* init address tree */
    avl_init(&interf->_if_addresses, avl_comp_netaddr, false);

    /* init link list */
    list_init_head(&interf->_links);

    /* init link address tree */
    avl_init(&interf->_link_addresses, avl_comp_netaddr, false);

    /*
     * init originator tree
     * (might temporarily have multiple links with the same originator)
     */
    avl_init(&interf->_link_originators, avl_comp_netaddr, true);

    /*
     * init twohop tree
     * (this tree allows duplicates to easily find all links to a
     * twohop link address)
     */
    avl_init(&interf->_if_twohops, avl_comp_netaddr, true);

    /* trigger event */
    oonf_class_event(&_interface_info, interf, OONF_OBJECT_ADDED);
  }

  OONF_INFO(LOG_NHDP, "Add interface to NHDP_interface tree: %s (refcount was %d)", name, interf->_refcount);

  /* keep track of users */
  interf->_refcount++;

  return interf;
}